

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O0

ANNdist annBoxDistance(ANNpoint q,ANNpoint lo,ANNpoint hi,int dim,double *Scale,int *Topology)

{
  double *pdVar1;
  ANNRectangle *this;
  int in_ECX;
  ANNcoord p4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar2;
  ANNdist AVar3;
  ANNRectangle *Rect;
  int d;
  ANNdist t1;
  ANNdist t;
  ANNdist dist;
  ANNcoord in_stack_ffffffffffffff98;
  ANNcoord in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  undefined8 local_40;
  undefined8 local_38;
  
  local_38 = 0.0;
  for (iVar4 = 0; iVar4 < in_ECX; iVar4 = iVar4 + 1) {
    if (*(int *)(in_R9 + (long)iVar4 * 4) == 2) {
      if (*(double *)(in_RSI + (long)iVar4 * 8) <= *(double *)(in_RDI + (long)iVar4 * 8)) {
        dVar2 = *(double *)(in_RDI + (long)iVar4 * 8);
        pdVar1 = (double *)(in_RDX + (long)iVar4 * 8);
        if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
          local_40 = *(double *)(in_RDI + (long)iVar4 * 8) - *(double *)(in_RDX + (long)iVar4 * 8);
          dVar2 = *(double *)(in_R8 + (long)iVar4 * 8) * 6.283185307179586 +
                  -ABS(*(double *)(in_RDI + (long)iVar4 * 8) - *(double *)(in_RSI + (long)iVar4 * 8)
                      );
          if (dVar2 < local_40) {
            local_40 = dVar2;
          }
          local_38 = local_40 * local_40 + local_38;
        }
      }
      else {
        local_40 = *(double *)(in_RSI + (long)iVar4 * 8) - *(double *)(in_RDI + (long)iVar4 * 8);
        dVar2 = *(double *)(in_R8 + (long)iVar4 * 8) * 6.283185307179586 +
                -ABS(*(double *)(in_RDX + (long)iVar4 * 8) - *(double *)(in_RDI + (long)iVar4 * 8));
        if (dVar2 < local_40) {
          local_40 = dVar2;
        }
        local_38 = local_40 * local_40 + local_38;
      }
    }
    else if (*(int *)(in_R9 + (long)iVar4 * 4) == 3) {
      this = (ANNRectangle *)operator_new(0x40);
      p4 = (ANNcoord)(long)iVar4;
      ANNRectangle::ANNRectangle
                (this,*(ANNcoord *)(in_RSI + (long)p4 * 8),*(ANNcoord *)(in_RDX + (long)p4 * 8),
                 *(ANNcoord *)(in_RSI + 8 + (long)p4 * 8),*(ANNcoord *)(in_RDX + 8 + (long)p4 * 8),
                 *(ANNcoord *)(in_RSI + 0x10 + (long)p4 * 8),
                 *(ANNcoord *)(in_RDX + 0x10 + (long)p4 * 8),
                 *(ANNcoord *)(in_RSI + 0x18 + (long)p4 * 8),
                 *(ANNcoord *)(in_RDX + 0x18 + (long)p4 * 8));
      local_40 = ANNRectangle::DistPointRectangle
                           ((ANNRectangle *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),(ANNcoord)this
                            ,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,p4);
      AVar3 = ANNRectangle::DistPointRectangle
                        ((ANNRectangle *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),(ANNcoord)this,
                         in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,p4);
      if (AVar3 < local_40) {
        local_40 = AVar3;
      }
      local_38 = local_38 + local_40;
      if (this != (ANNRectangle *)0x0) {
        ANNRectangle::~ANNRectangle(this);
        operator_delete(this);
      }
      iVar4 = iVar4 + 3;
    }
    else if (*(double *)(in_RSI + (long)iVar4 * 8) <= *(double *)(in_RDI + (long)iVar4 * 8)) {
      dVar2 = *(double *)(in_RDI + (long)iVar4 * 8);
      pdVar1 = (double *)(in_RDX + (long)iVar4 * 8);
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        dVar2 = *(double *)(in_RDI + (long)iVar4 * 8) - *(double *)(in_RDX + (long)iVar4 * 8);
        local_38 = dVar2 * dVar2 + local_38;
      }
    }
    else {
      dVar2 = *(double *)(in_RSI + (long)iVar4 * 8) - *(double *)(in_RDI + (long)iVar4 * 8);
      local_38 = dVar2 * dVar2 + local_38;
    }
  }
  return local_38;
}

Assistant:

ANNdist annBoxDistance(  // compute distance from point to box
    const ANNpoint q,    // the point
    const ANNpoint lo,   // low point of box
    const ANNpoint hi,   // high point of box
    int dim,             // dimension of space
    double *Scale,       // scaling coefficient
    int *Topology)       // topology of the space
{
    register ANNdist dist = 0.0;  // sum of squared distances
    register ANNdist t, t1;

    for (register int d = 0; d < dim; d++) {
        if (Topology[d] == 2) {
            if (q[d] < lo[d]) {  // q is left of box
                t = ANNdist(lo[d]) - ANNdist(q[d]);
                t1 = 2 * PI * Scale[d] - fabs(ANNdist(hi[d]) - ANNdist(q[d]));
                if (t1 < t) t = t1;
                dist = ANN_SUM(dist, ANN_POW(t));
            } else if (q[d] > hi[d]) {  // q is right of box
                t = ANNdist(q[d]) - ANNdist(hi[d]);
                t1 = 2 * PI * Scale[d] - fabs(ANNdist(q[d]) - ANNdist(lo[d]));
                if (t1 < t) t = t1;
                dist = ANN_SUM(dist, ANN_POW(t));
            }
        } else if (Topology[d] == 3) {
            register ANNRectangle *Rect =
                new ANNRectangle(lo[d], hi[d], lo[d + 1], hi[d + 1], lo[d + 2],
                                 hi[d + 2], lo[d + 3], hi[d + 3]);
            t = Rect->DistPointRectangle(q[d], q[d + 1], q[d + 2], q[d + 3]);
            t1 = Rect->DistPointRectangle(-q[d], -q[d + 1], -q[d + 2],
                                          -q[d + 3]);
            if (t1 < t) t = t1;
            dist = ANN_SUM(dist, t);

            delete Rect;
            d = d + 3;
        } else {
            if (q[d] < lo[d]) {  // q is left of box
                t = ANNdist(lo[d]) - ANNdist(q[d]);
                dist = ANN_SUM(dist, ANN_POW(t));
            } else if (q[d] > hi[d]) {  // q is right of box
                t = ANNdist(q[d]) - ANNdist(hi[d]);
                dist = ANN_SUM(dist, ANN_POW(t));
            }
        }
    }
    //    FLOP(4*dim)				// increment floating op count

    return dist;
}